

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

string * __thiscall
argparse::Argument::get_names_csv_abi_cxx11_
          (string *__return_storage_ptr__,Argument *this,char separator)

{
  pointer pbVar1;
  pointer name;
  char local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  anon_class_8_1_7ce16985 local_58;
  string local_50;
  
  name = (this->m_names).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_79 = separator;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  if (name != pbVar1) {
    local_58.separator = &local_79;
    do {
      get_names_csv::anon_class_8_1_7ce16985::operator()(&local_50,&local_58,&local_78,name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_78,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      name = name + 1;
    } while (name != pbVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == &local_78.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_78.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_78._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_78.field_2._M_allocated_capacity
    ;
  }
  __return_storage_ptr__->_M_string_length = local_78._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

std::string get_names_csv(char separator = ',') const {
    return std::accumulate(
        m_names.begin(), m_names.end(), std::string{""},
        [&](const std::string &result, const std::string &name) {
          return result.empty() ? name : result + separator + name;
        });
  }